

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O3

void Inta_ManProofWriteOne(Inta_Man_t *p,Sto_Cls_t *pClause)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  iVar4 = p->Counter + 1;
  p->Counter = iVar4;
  piVar2 = p->pProofNums;
  piVar2[pClause->Id] = iVar4;
  if (p->fProofWrite != 0) {
    fprintf((FILE *)p->pFile,"%d",(ulong)(uint)piVar2[pClause->Id]);
    if ((*(uint *)&pClause->field_0x1c & 0x7fffff8) != 0) {
      uVar6 = 0;
      do {
        uVar1 = *(uint *)((long)&pClause[1].pNext + uVar6 * 4);
        uVar5 = (int)uVar1 >> 1;
        uVar3 = ~uVar5;
        if ((uVar1 & 1) == 0) {
          uVar3 = uVar5 + 1;
        }
        fprintf((FILE *)p->pFile," %d",(ulong)uVar3);
        uVar6 = uVar6 + 1;
      } while (uVar6 < (*(uint *)&pClause->field_0x1c >> 3 & 0xffffff));
    }
    fwrite(" 0 0\n",5,1,(FILE *)p->pFile);
    return;
  }
  return;
}

Assistant:

void Inta_ManProofWriteOne( Inta_Man_t * p, Sto_Cls_t * pClause )
{
    Inta_ManProofSet( p, pClause, ++p->Counter );

    if ( p->fProofWrite )
    {
        int v;
        fprintf( p->pFile, "%d", Inta_ManProofGet(p, pClause) );
        for ( v = 0; v < (int)pClause->nLits; v++ )
            fprintf( p->pFile, " %d", lit_print(pClause->pLits[v]) );
        fprintf( p->pFile, " 0 0\n" );
    }
}